

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  int iVar3;
  Type *field;
  OneofOptions *this_00;
  string *output;
  LocationRecorder local_70;
  undefined1 local_60 [40];
  _Alloc_hider local_38;
  
  local_60._20_4_ = oneof_index;
  local_60._24_8_ = containing_type;
  bVar2 = Consume(this,"oneof");
  if (bVar2) {
    LocationRecorder::LocationRecorder(&local_70,oneof_location,1);
    *(byte *)(oneof_decl->_has_bits_).has_bits_ = (byte)(oneof_decl->_has_bits_).has_bits_[0] | 1;
    output = (oneof_decl->name_).ptr_;
    if (output == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&oneof_decl->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      output = (oneof_decl->name_).ptr_;
    }
    bVar2 = ConsumeIdentifier(this,output,"Expected oneof name.");
    LocationRecorder::~LocationRecorder(&local_70);
    if ((bVar2) && (bVar2 = ConsumeEndOfDeclaration(this,"{",oneof_location), bVar2)) {
      local_38._M_p = (pointer)(local_60._24_8_ + 0x18);
      local_60._32_8_ = local_60._24_8_ + 0x30;
      while ((this->input_->current_).type != TYPE_END) {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 == 0) {
          LocationRecorder::LocationRecorder(&local_70,oneof_location,2);
          *(byte *)(oneof_decl->_has_bits_).has_bits_ =
               (byte)(oneof_decl->_has_bits_).has_bits_[0] | 2;
          this_00 = oneof_decl->options_;
          if (this_00 == (OneofOptions *)0x0) {
            this_00 = (OneofOptions *)operator_new(0x68);
            OneofOptions::OneofOptions(this_00);
            oneof_decl->options_ = this_00;
          }
          bVar2 = ParseOption(this,&this_00->super_Message,&local_70,containing_file,
                              OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder(&local_70);
          if (!bVar2) {
            return false;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (((iVar3 == 0) ||
              (iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text),
              iVar3 == 0)) ||
             (iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text),
             iVar3 == 0)) {
            local_70.parser_ = (Parser *)local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,
                       "Fields in oneofs must not have labels (required / optional / repeated).","")
            ;
            pEVar1 = this->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,&local_70);
            }
            this->had_errors_ = true;
            if (local_70.parser_ != (Parser *)local_60) {
              operator_delete(local_70.parser_,(ulong)((long)&((Token *)local_60._0_8_)->type + 1));
            }
            io::Tokenizer::Next(this->input_);
          }
          LocationRecorder::LocationRecorder
                    (&local_70,containing_type_location,2,
                     (((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                      (local_60._24_8_ + 0x18))->super_RepeatedPtrFieldBase).current_size_);
          field = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_38._M_p,(Type *)0x0);
          bVar2 = FieldDescriptorProto_Label_IsValid(1);
          if (!bVar2) {
            __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                          ,0x1487,
                          "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                         );
          }
          field->label_ = 1;
          (field->_has_bits_).has_bits_[0] = (field->_has_bits_).has_bits_[0] | 0x180;
          field->oneof_index_ = local_60._20_4_;
          bVar2 = ParseMessageFieldNoLabel
                            (this,field,
                             (RepeatedPtrField<google::protobuf::DescriptorProto> *)local_60._32_8_,
                             containing_type_location,3,&local_70,containing_file);
          if (!bVar2) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_70);
        }
        bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        if (bVar2) {
          return true;
        }
      }
      local_70.parser_ = (Parser *)local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Reached end of input in oneof definition (missing \'}\').","")
      ;
      pEVar1 = this->error_collector_;
      if (pEVar1 != (ErrorCollector *)0x0) {
        (*pEVar1->_vptr_ErrorCollector[2])
                  (pEVar1,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_70);
      }
      this->had_errors_ = true;
      if (local_70.parser_ != (Parser *)local_60) {
        operator_delete(local_70.parser_,(ulong)((long)&((Token *)local_60._0_8_)->type + 1));
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type,
                        int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      AddError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") ||
        LookingAt("optional") ||
        LookingAt("repeated")) {
      AddError("Fields in oneofs must not have labels (required / optional "
               "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field,
                                  containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location,
                                  containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}